

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O3

void __thiscall
PDA::Transducer::Generator::Generator(Generator *this,Tokenizer *tokenizer,StoreFst *storeFst)

{
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar1;
  long *plVar2;
  pointer pIVar3;
  bool bVar4;
  wostream *pwVar5;
  vector<PDA::Transducer::Identifier,_std::allocator<PDA::Transducer::Identifier>_> *pvVar6;
  long lVar7;
  wchar_t in_R8D;
  wofstream ostream;
  wstring local_258;
  wstring local_238;
  long local_218;
  wfilebuf local_210 [240];
  ios_base local_120 [264];
  
  this->m_mainFunctionExists = -1;
  this->m_tokenizer = tokenizer;
  this->m_storeFst = storeFst;
  std::wofstream::wofstream((wostream *)&local_218,"result.s",_S_out);
  pwVar5 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                     ((wostream *)&local_218,Constants::firstLineComment_abi_cxx11_,DAT_0014f720);
  plVar2 = *(long **)(pwVar5 + *(long *)(*(long *)pwVar5 + -0x18) + 0xf0);
  if (plVar2 != (long *)0x0) {
    (**(code **)(*plVar2 + 0x50))(plVar2,10);
    std::wostream::put((wchar_t)pwVar5);
    std::wostream::flush();
    pwVar5 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                       ((wostream *)&local_218,Constants::sectionDataString_abi_cxx11_,DAT_0014f740)
    ;
    plVar2 = *(long **)(pwVar5 + *(long *)(*(long *)pwVar5 + -0x18) + 0xf0);
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 0x50))(plVar2,10);
      std::wostream::put((wchar_t)pwVar5);
      std::wostream::flush();
      pwVar5 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                         ((wostream *)&local_218,Constants::integerOutputStringLabel_abi_cxx11_,
                          DAT_0014f7a0);
      local_258._M_dataplus._M_p._0_4_ = 0x3a;
      pwVar5 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                         (pwVar5,(wchar_t *)&local_258,1);
      plVar2 = *(long **)(pwVar5 + *(long *)(*(long *)pwVar5 + -0x18) + 0xf0);
      if (plVar2 != (long *)0x0) {
        (**(code **)(*plVar2 + 0x50))(plVar2,10);
        std::wostream::put((wchar_t)pwVar5);
        std::wostream::flush();
        pwVar5 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                           ((wostream *)&local_218,Constants::integerOutputString_abi_cxx11_,
                            DAT_0014f7c0);
        plVar2 = *(long **)(pwVar5 + *(long *)(*(long *)pwVar5 + -0x18) + 0xf0);
        if (plVar2 != (long *)0x0) {
          (**(code **)(*plVar2 + 0x50))(plVar2,10);
          std::wostream::put((wchar_t)pwVar5);
          std::wostream::flush();
          pwVar5 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                             ((wostream *)&local_218,Constants::integerInputStringLabel_abi_cxx11_,
                              DAT_0014f7e0);
          local_258._M_dataplus._M_p._0_4_ = 0x3a;
          pwVar5 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                             (pwVar5,(wchar_t *)&local_258,1);
          plVar2 = *(long **)(pwVar5 + *(long *)(*(long *)pwVar5 + -0x18) + 0xf0);
          if (plVar2 != (long *)0x0) {
            (**(code **)(*plVar2 + 0x50))(plVar2,10);
            std::wostream::put((wchar_t)pwVar5);
            std::wostream::flush();
            pwVar5 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                               ((wostream *)&local_218,Constants::integerInputString_abi_cxx11_,
                                DAT_0014f800);
            plVar2 = *(long **)(pwVar5 + *(long *)(*(long *)pwVar5 + -0x18) + 0xf0);
            if (plVar2 != (long *)0x0) {
              (**(code **)(*plVar2 + 0x50))(plVar2,10);
              std::wostream::put((wchar_t)pwVar5);
              std::wostream::flush();
              pwVar5 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                                 ((wostream *)&local_218,
                                  Constants::sectionUninitializedDataString_abi_cxx11_,DAT_0014f760)
              ;
              plVar2 = *(long **)(pwVar5 + *(long *)(*(long *)pwVar5 + -0x18) + 0xf0);
              if (plVar2 != (long *)0x0) {
                (**(code **)(*plVar2 + 0x50))(plVar2,10);
                std::wostream::put((wchar_t)pwVar5);
                std::wostream::flush();
                pwVar5 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                                   ((wostream *)&local_218,Constants::sectionTextString_abi_cxx11_,
                                    DAT_0014f780);
                plVar2 = *(long **)(pwVar5 + *(long *)(*(long *)pwVar5 + -0x18) + 0xf0);
                if (plVar2 != (long *)0x0) {
                  (**(code **)(*plVar2 + 0x50))(plVar2,10);
                  std::wostream::put((wchar_t)pwVar5);
                  std::wostream::flush();
                  bVar4 = isMainFunctionExists(this);
                  if (!bVar4) {
                    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
                    std::__cxx11::wstring::_M_construct<wchar_t_const*>
                              ((wstring *)&local_238,
                               L"Main function not found, then all functions are extern",L"");
                    comment(&local_258,&local_238);
                    pwVar5 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                                       ((wostream *)&local_218,local_258._M_dataplus._M_p,
                                        local_258._M_string_length);
                    plVar2 = *(long **)(pwVar5 + *(long *)(*(long *)pwVar5 + -0x18) + 0xf0);
                    if (plVar2 == (long *)0x0) {
                      std::__throw_bad_cast();
                    }
                    (**(code **)(*plVar2 + 0x50))(plVar2,10);
                    std::wostream::put((wchar_t)pwVar5);
                    std::wostream::flush();
                    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                         *)local_258._M_dataplus._M_p != &local_258.field_2) {
                      operator_delete(local_258._M_dataplus._M_p,
                                      local_258.field_2._M_allocated_capacity * 4 + 4);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                         *)local_238._M_dataplus._M_p != &local_238.field_2) {
                      operator_delete(local_238._M_dataplus._M_p,
                                      local_238.field_2._M_allocated_capacity * 4 + 4);
                    }
                    writeGlobalFunctions(this,(wostream *)&local_218);
LAB_0012cfa8:
                    writeFunctions(this,(wostream *)&local_218);
                    local_218 = _VTT;
                    *(undefined8 *)(local_210 + *(long *)(_VTT + -0x18) + -8) = _insert;
                    std::wfilebuf::~wfilebuf(local_210);
                    std::ios_base::~ios_base(local_120);
                    return;
                  }
                  pwVar5 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                                     ((wostream *)&local_218,Constants::globlStartLabel_abi_cxx11_,
                                      DAT_0014f6e0);
                  plVar2 = *(long **)(pwVar5 + *(long *)(*(long *)pwVar5 + -0x18) + 0xf0);
                  if (plVar2 != (long *)0x0) {
                    (**(code **)(*plVar2 + 0x50))(plVar2,10);
                    std::wostream::put((wchar_t)pwVar5);
                    std::wostream::flush();
                    pwVar5 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                                       ((wostream *)&local_218,Constants::startLabel_abi_cxx11_,
                                        DAT_0014f700);
                    plVar2 = *(long **)(pwVar5 + *(long *)(*(long *)pwVar5 + -0x18) + 0xf0);
                    if (plVar2 != (long *)0x0) {
                      (**(code **)(*plVar2 + 0x50))(plVar2,10);
                      std::wostream::put((wchar_t)pwVar5);
                      std::wostream::flush();
                      pvVar6 = Tokenizer::identifiers(this->m_tokenizer);
                      lVar7 = (long)this->m_mainFunctionExists;
                      pIVar3 = (pvVar6->
                               super__Vector_base<PDA::Transducer::Identifier,_std::allocator<PDA::Transducer::Identifier>_>
                               )._M_impl.super__Vector_impl_data._M_start;
                      Utils::Misc::toBase64_abi_cxx11_
                                (&local_238,(Misc *)pIVar3[lVar7].decoratedName._M_dataplus._M_p,
                                 (uchar *)(pIVar3[lVar7].decoratedName._M_string_length << 2),
                                 lVar7 * 0xa0);
                      call(&local_258,&local_238);
                      pwVar5 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                                         ((wostream *)&local_218,local_258._M_dataplus._M_p,
                                          local_258._M_string_length);
                      plVar2 = *(long **)(pwVar5 + *(long *)(*(long *)pwVar5 + -0x18) + 0xf0);
                      if (plVar2 == (long *)0x0) {
                        std::__throw_bad_cast();
                      }
                      (**(code **)(*plVar2 + 0x50))(plVar2,10);
                      std::wostream::put((wchar_t)pwVar5);
                      std::wostream::flush();
                      paVar1 = &local_258.field_2;
                      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                           *)local_258._M_dataplus._M_p != paVar1) {
                        operator_delete(local_258._M_dataplus._M_p,
                                        local_258.field_2._M_allocated_capacity * 4 + 4);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                           *)local_238._M_dataplus._M_p != &local_238.field_2) {
                        operator_delete(local_238._M_dataplus._M_p,
                                        local_238.field_2._M_allocated_capacity * 4 + 4);
                      }
                      local_238._M_dataplus._M_p._0_1_ = 1;
                      local_238._M_dataplus._M_p = local_238._M_dataplus._M_p & 0xffffffff;
                      local_238._M_string_length._0_2_ = 0x50;
                      local_238._M_string_length._2_1_ = 0;
                      local_238._M_string_length._4_4_ = 0;
                      mov_abi_cxx11_(&local_258,(Generator *)0x3c,(int)&local_238,(Register *)0x0,
                                     in_R8D);
                      pwVar5 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                                         ((wostream *)&local_218,local_258._M_dataplus._M_p,
                                          local_258._M_string_length);
                      plVar2 = *(long **)(pwVar5 + *(long *)(*(long *)pwVar5 + -0x18) + 0xf0);
                      if (plVar2 == (long *)0x0) {
                        std::__throw_bad_cast();
                      }
                      (**(code **)(*plVar2 + 0x50))(plVar2,10);
                      std::wostream::put((wchar_t)pwVar5);
                      std::wostream::flush();
                      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                           *)local_258._M_dataplus._M_p != paVar1) {
                        operator_delete(local_258._M_dataplus._M_p,
                                        local_258.field_2._M_allocated_capacity * 4 + 4);
                      }
                      local_238._M_dataplus._M_p._0_1_ = 1;
                      local_238._M_dataplus._M_p = local_238._M_dataplus._M_p & 0xffffffff;
                      local_238._M_string_length._0_2_ = 0;
                      local_238._M_string_length._2_1_ = 0;
                      local_238._M_string_length._4_4_ = 0;
                      mov_abi_cxx11_(&local_258,(Generator *)0x0,(int)&local_238,(Register *)0x0,
                                     in_R8D);
                      pwVar5 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                                         ((wostream *)&local_218,local_258._M_dataplus._M_p,
                                          local_258._M_string_length);
                      plVar2 = *(long **)(pwVar5 + *(long *)(*(long *)pwVar5 + -0x18) + 0xf0);
                      if (plVar2 == (long *)0x0) {
                        std::__throw_bad_cast();
                      }
                      (**(code **)(*plVar2 + 0x50))(plVar2,10);
                      std::wostream::put((wchar_t)pwVar5);
                      std::wostream::flush();
                      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                           *)local_258._M_dataplus._M_p != paVar1) {
                        operator_delete(local_258._M_dataplus._M_p,
                                        local_258.field_2._M_allocated_capacity * 4 + 4);
                      }
                      local_258._M_dataplus._M_p = (pointer)paVar1;
                      std::__cxx11::wstring::_M_construct<wchar_t_const*>
                                ((wstring *)&local_258,L"syscall",L"");
                      pwVar5 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                                         ((wostream *)&local_218,local_258._M_dataplus._M_p,
                                          local_258._M_string_length);
                      plVar2 = *(long **)(pwVar5 + *(long *)(*(long *)pwVar5 + -0x18) + 0xf0);
                      if (plVar2 == (long *)0x0) {
                        std::__throw_bad_cast();
                      }
                      (**(code **)(*plVar2 + 0x50))(plVar2,10);
                      std::wostream::put((wchar_t)pwVar5);
                      std::wostream::flush();
                      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                           *)local_258._M_dataplus._M_p != paVar1) {
                        operator_delete(local_258._M_dataplus._M_p,
                                        local_258.field_2._M_allocated_capacity * 4 + 4);
                      }
                      goto LAB_0012cfa8;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  std::__throw_bad_cast();
}

Assistant:

Generator::Generator(const Tokenizer &tokenizer, const StoreFst &storeFst) :
    m_mainFunctionExists(-1), m_tokenizer(tokenizer),
    m_storeFst(storeFst)
{
    std::wofstream ostream("result.s");
    ostream << Constants::firstLineComment << std::endl;
    ostream << Constants::sectionDataString << std::endl;
    ostream << Constants::integerOutputStringLabel << L':' << std::endl;
    ostream << Constants::integerOutputString << std::endl;
    ostream << Constants::integerInputStringLabel << L':' << std::endl;
    ostream << Constants::integerInputString << std::endl;
    //writeLiterals(ostream);
    ostream << Constants::sectionUninitializedDataString << std::endl;
    ostream << Constants::sectionTextString << std::endl;
    if (isMainFunctionExists())
    {
        ostream << Constants::globlStartLabel << std::endl;
        ostream << Constants::startLabel << std::endl;
        ostream << call(  hash(m_tokenizer.identifiers()[static_cast<size_t>(m_mainFunctionExists)].decoratedName) ) << std::endl;
        ostream << mov(60, Register(Register::ReturnType, Register::Size::Full)) << std::endl;
        ostream << mov(0, Register(0, Register::Size::Full)) << std::endl;
        ostream << syscall() << std::endl;
    }
    else
    {
        ostream << comment(L"Main function not found, then all functions are extern") << std::endl;
        writeGlobalFunctions(ostream);
    }
    writeFunctions(ostream);
}